

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

_tExecReaction __thiscall yactfr::internal::Vm::_execReadFlBitMapBeRev(Vm *this,Instr *instr)

{
  FixedLengthBitMapElement *elem;
  Index IVar1;
  Index IVar2;
  ElementSequenceIterator *pEVar3;
  unsigned_long uVar4;
  
  uVar4 = _readFlInt<unsigned_long,_yactfr::internal::(anonymous_namespace)::readFlUIntBeFuncs,_true>
                    (this,instr);
  elem = &(this->_pos).elems.flBitMap;
  IVar1 = (this->_pos).headOffsetInCurPktBits;
  IVar2 = (this->_pos).curPktOffsetInElemSeqBits;
  _setDataElemFromInstr<yactfr::FixedLengthBitMapElement>(elem,instr);
  (this->_pos).lastIntVal.u = uVar4;
  (this->_pos).elems.flBitMap.super_FixedLengthBitArrayElement.super_NumberElement._theVal.u = uVar4
  ;
  pEVar3 = this->_it;
  pEVar3->_curElem = (Element *)elem;
  pEVar3->_offset = IVar1 + IVar2;
  pEVar3->_mark = pEVar3->_mark + 1;
  _consumeExistingBits(this,(ulong)*(uint *)((long)&instr[2]._vptr_Instr + 4));
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execReadFlBitMapBeRev(const Instr& instr)
{
    this->_execReadFlBitMap<readFlUIntBeFuncs, true>(instr);
    return _tExecReaction::FetchNextInstrAndStop;
}